

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall
efsw::DirectorySnapshot::DirectorySnapshot(DirectorySnapshot *this,string *directory)

{
  _Rb_tree_header *p_Var1;
  string local_30 [32];
  
  FileInfo::FileInfo(&this->DirectoryInfo);
  p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string(local_30,(string *)directory);
  init(this,(EVP_PKEY_CTX *)local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

DirectorySnapshot::DirectorySnapshot( std::string directory ) {
	init( directory );
}